

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O2

u32 __thiscall moira::Moira::bcd<(moira::Core)1,(moira::Instr)249,1>(Moira *this,u32 op1,u32 op2)

{
  byte bVar1;
  uint uVar2;
  u32 uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (uint)(this->reg).sr.x + (op2 & 0xf) + (op1 & 0xf);
  uVar4 = (op2 & 0xf0) + (op1 & 0xf0) + uVar2;
  uVar5 = uVar4 + 6;
  if (uVar2 < 10) {
    uVar5 = uVar4;
  }
  uVar2 = uVar5 & 0x3f0;
  uVar3 = uVar5 + 0x60;
  if (uVar2 < 0x91) {
    uVar3 = uVar5;
  }
  bVar1 = (byte)uVar3;
  (this->reg).sr.x = 0x90 < uVar2;
  (this->reg).sr.c = 0x90 < uVar2;
  (this->reg).sr.v = (char)bVar1 < '\0' && -1 < (char)uVar4;
  (this->reg).sr.n = (bool)(bVar1 >> 7);
  if (bVar1 != 0) {
    (this->reg).sr.z = false;
  }
  return uVar3;
}

Assistant:

u32
Moira::bcd(u32 op1, u32 op2)
{
    u64 tmp, result;

    // Extract digits
    u16 hi1 = op1 & 0xF0, lo1 = op1 & 0x0F;
    u16 hi2 = op2 & 0xF0, lo2 = op2 & 0x0F;

    switch (I) {

        case Instr::ABCD:
        case Instr::ABCD_LOOP:
        {
            // Add digits
            u16 lo = lo1 + lo2 + reg.sr.x;
            u16 hi = hi1 + hi2;
            result = tmp = hi + lo;

            // Rectify first digit
            if (lo > 9) {
                result += 0x06;
            }

            // Rectify second digit
            if ((result & 0x3F0) > 0x90) {
                result += 0x60;
                reg.sr.x = 1;
            } else {
                reg.sr.x = 0;
            }

            // Set V flag
            if constexpr (C != Core::C68020) {
                reg.sr.v = ((tmp & 0x80) == 0) && ((result & 0x80) == 0x80);
            } else {
                reg.sr.v = 0;
            }

            break;
        }
        case Instr::SBCD:
        case Instr::SBCD_LOOP:
        {
            // Subtract digits
            u16 lo = lo2 - lo1 - reg.sr.x;
            u16 hi = hi2 - hi1;
            result = tmp = hi + lo;

            // Rectify first digit
            if (lo & 0xF0) {
                result -= 0x06;
                reg.sr.x = ((op2 - op1 - 6 - reg.sr.x) & 0x300) > 0xFF;
            } else {
                reg.sr.x = ((op2 - op1 - reg.sr.x) & 0x300) > 0xFF;
            }

            // Rectify second digit
            if (((op2 - op1 - reg.sr.x) & 0x100) > 0xFF) {
                result -= 0x60;
            }

            // Set V flag
            if constexpr (C != Core::C68020) {
                reg.sr.v = ((tmp & 0x80) == 0x80) && ((result & 0x80) == 0);
            } else {
                reg.sr.v = 0;
            }

            break;
        }

        default:
            fatalError;
    }

    // Set other flags
    reg.sr.c = reg.sr.x;
    reg.sr.n = NBIT<S>(result);
    if (CLIP<Byte>(result)) reg.sr.z = 0;

    return (u32)result;
}